

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O0

CURLUcode redirect_url(char *base,char *relurl,CURLU *u,uint flags)

{
  char cVar1;
  CURLcode CVar2;
  CURLUcode CVar3;
  size_t sVar4;
  char *pcVar5;
  size_t local_a8;
  size_t local_a0;
  char *protsep;
  CURLUcode uc;
  size_t prelen;
  char *cutoff;
  char *useurl;
  undefined1 local_50 [7];
  _Bool host_changed;
  dynbuf urlbuf;
  uint flags_local;
  CURLU *u_local;
  char *relurl_local;
  char *base_local;
  
  useurl._7_1_ = false;
  prelen = 0;
  urlbuf.toobig._4_4_ = flags;
  sVar4 = strlen(u->scheme);
  pcVar5 = base + sVar4 + 3;
  if (base == (char *)0x0) {
    return CURLUE_MALFORMED_INPUT;
  }
  cutoff = relurl;
  if (*relurl == '#') {
    if (u->fragment != (char *)0x0) {
      prelen = (size_t)strchr(pcVar5,0x23);
    }
  }
  else if (*relurl == '/') {
    cVar1 = relurl[1];
    if (cVar1 != '/') {
      prelen = (size_t)strchr(pcVar5,0x2f);
    }
    else {
      cutoff = relurl + 2;
      prelen = (size_t)pcVar5;
    }
    useurl._7_1_ = cVar1 == '/';
  }
  else {
    if ((u->query == (char *)0x0) || (*u->query == '\0')) {
      if ((u->fragment != (char *)0x0) && (*u->fragment != '\0')) {
        prelen = (size_t)strchr(pcVar5,0x23);
      }
    }
    else {
      prelen = (size_t)strchr(pcVar5,0x3f);
    }
    if (*relurl != '?') {
      if (prelen == 0) {
        local_a0 = strlen(pcVar5);
      }
      else {
        local_a0 = prelen - (long)pcVar5;
      }
      prelen = (size_t)memrchr(pcVar5,0x2f,local_a0);
      if ((void *)prelen != (void *)0x0) {
        prelen = prelen + 1;
      }
    }
  }
  if (prelen == 0) {
    local_a8 = strlen(base);
  }
  else {
    local_a8 = prelen - (long)base;
  }
  Curl_dyn_init((dynbuf *)local_50,8000000);
  CVar2 = Curl_dyn_addn((dynbuf *)local_50,base,local_a8);
  if (CVar2 == CURLE_OK) {
    sVar4 = strlen(cutoff);
    CVar3 = urlencode_str((dynbuf *)local_50,cutoff,sVar4,(_Bool)((useurl._7_1_ ^ 0xffU) & 1),false)
    ;
    if (CVar3 == CURLUE_OK) {
      pcVar5 = Curl_dyn_ptr((dynbuf *)local_50);
      protsep._4_4_ = parseurl_and_replace(pcVar5,u,urlbuf.toobig._4_4_ & 0xffffffef);
      goto LAB_001a63b8;
    }
  }
  protsep._4_4_ = CURLUE_OUT_OF_MEMORY;
LAB_001a63b8:
  Curl_dyn_free((dynbuf *)local_50);
  return protsep._4_4_;
}

Assistant:

static CURLUcode redirect_url(const char *base, const char *relurl,
                              CURLU *u, unsigned int flags)
{
  struct dynbuf urlbuf;
  bool host_changed = FALSE;
  const char *useurl = relurl;
  const char *cutoff = NULL;
  size_t prelen;
  CURLUcode uc;

  /* protsep points to the start of the hostname, after [scheme]:// */
  const char *protsep = base + strlen(u->scheme) + 3;
  DEBUGASSERT(base && relurl && u); /* all set here */
  if(!base)
    return CURLUE_MALFORMED_INPUT; /* should never happen */

  /* handle different relative URL types */
  switch(relurl[0]) {
  case '/':
    if(relurl[1] == '/') {
      /* protocol-relative URL: //example.com/path */
      cutoff = protsep;
      useurl = &relurl[2];
      host_changed = TRUE;
    }
    else
      /* absolute /path */
      cutoff = strchr(protsep, '/');
    break;

  case '#':
    /* fragment-only change */
    if(u->fragment)
      cutoff = strchr(protsep, '#');
    break;

  default:
    /* path or query-only change */
    if(u->query && u->query[0])
      /* remove existing query */
      cutoff = strchr(protsep, '?');
    else if(u->fragment && u->fragment[0])
      /* Remove existing fragment */
      cutoff = strchr(protsep, '#');

    if(relurl[0] != '?') {
      /* append a relative path after the last slash */
      cutoff = memrchr(protsep, '/',
                       cutoff ? (size_t)(cutoff - protsep) : strlen(protsep));
      if(cutoff)
        cutoff++; /* truncate after last slash */
    }
    break;
  }

  prelen = cutoff ? (size_t)(cutoff - base) : strlen(base);

  /* build new URL */
  Curl_dyn_init(&urlbuf, CURL_MAX_INPUT_LENGTH);

  if(!Curl_dyn_addn(&urlbuf, base, prelen) &&
     !urlencode_str(&urlbuf, useurl, strlen(useurl), !host_changed, FALSE)) {
    uc = parseurl_and_replace(Curl_dyn_ptr(&urlbuf), u,
                              flags & ~CURLU_PATH_AS_IS);
  }
  else
    uc = CURLUE_OUT_OF_MEMORY;

  Curl_dyn_free(&urlbuf);
  return uc;
}